

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_packing_pass.cpp
# Opt level: O2

Status __thiscall spvtools::opt::StructPackingPass::Process(StructPackingPass *this)

{
  uint32_t id;
  Status SVar1;
  DefUseManager *this_00;
  Instruction *structDef;
  vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  structMemberTypes;
  spv_position_t local_38;
  
  if (this->packingRules_ == Undefined) {
    SVar1 = Failure;
    if ((this->super_Pass).consumer_.super__Function_base._M_manager != (_Manager_type)0x0) {
      structMemberTypes.
      super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      structMemberTypes.
      super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      structMemberTypes.
      super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
      ::operator()(&(this->super_Pass).consumer_,SPV_MSG_ERROR,"",
                   (spv_position_t *)&structMemberTypes,"Cannot pack struct with undefined rule");
    }
  }
  else {
    buildConstantsMap(this);
    id = findStructIdByName(this,(this->structToPack_)._M_dataplus._M_p);
    this_00 = IRContext::get_def_use_mgr((this->super_Pass).context_);
    structDef = analysis::DefUseManager::GetDef(this_00,id);
    if ((structDef == (Instruction *)0x0) || (structDef->opcode_ != OpTypeStruct)) {
      SVar1 = Failure;
      if ((this->super_Pass).consumer_.super__Function_base._M_manager != (_Manager_type)0x0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &structMemberTypes,"Failed to find struct with name ",&this->structToPack_);
        local_38.line = 0;
        local_38.column = 0;
        local_38.index = 0;
        std::
        function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
        operator()(&(this->super_Pass).consumer_,SPV_MSG_ERROR,"",&local_38,
                   (char *)structMemberTypes.
                           super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                           ._M_impl.super__Vector_impl_data._M_start);
        std::__cxx11::string::_M_dispose();
      }
    }
    else {
      findStructMemberTypes(&structMemberTypes,this,structDef);
      SVar1 = assignStructMemberOffsets(this,id,&structMemberTypes);
      std::
      _Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
      ::~_Vector_base(&structMemberTypes.
                       super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                     );
    }
  }
  return SVar1;
}

Assistant:

Pass::Status StructPackingPass::Process() {
  if (packingRules_ == PackingRules::Undefined) {
    if (consumer()) {
      consumer()(SPV_MSG_ERROR, "", {0, 0, 0},
                 "Cannot pack struct with undefined rule");
    }
    return Status::Failure;
  }

  // Build Id-to-instruction map for easier access
  buildConstantsMap();

  // Find structure of interest
  const uint32_t structIdToPack = findStructIdByName(structToPack_.c_str());

  const Instruction* structDef =
      context()->get_def_use_mgr()->GetDef(structIdToPack);
  if (structDef == nullptr || structDef->opcode() != spv::Op::OpTypeStruct) {
    if (consumer()) {
      const std::string message =
          "Failed to find struct with name " + structToPack_;
      consumer()(SPV_MSG_ERROR, "", {0, 0, 0}, message.c_str());
    }
    return Status::Failure;
  }

  // Find all struct member types
  std::vector<const analysis::Type*> structMemberTypes =
      findStructMemberTypes(*structDef);

  return assignStructMemberOffsets(structIdToPack, structMemberTypes);
}